

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::base_sink<spdlog::details::null_mutex>::set_pattern_
          (base_sink<spdlog::details::null_mutex> *this,string *pattern)

{
  _Alloc_hider _Var1;
  _Alloc_hider local_18;
  
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  _Var1._M_p = local_18._M_p;
  local_18._M_p = (pointer)0x0;
  (*(this->super_sink)._vptr_sink[9])(this);
  if ((long *)_Var1._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var1._M_p + 8))();
  }
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_pattern_(const std::string &pattern) {
    set_formatter_(details::make_unique<spdlog::pattern_formatter>(pattern));
}